

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O0

void __thiscall cmCacheManager::CacheEntry::SetProperty(CacheEntry *this,string *prop,char *value)

{
  bool bVar1;
  CacheEntryType CVar2;
  char *local_38;
  char *local_30;
  char *value_local;
  string *prop_local;
  CacheEntry *this_local;
  
  bVar1 = std::operator==(prop,"TYPE");
  if (bVar1) {
    local_30 = value;
    if (value == (char *)0x0) {
      local_30 = "STRING";
    }
    CVar2 = cmState::StringToCacheEntryType(local_30);
    this->Type = CVar2;
  }
  else {
    bVar1 = std::operator==(prop,"VALUE");
    if (bVar1) {
      local_38 = value;
      if (value == (char *)0x0) {
        local_38 = "";
      }
      std::__cxx11::string::operator=((string *)this,local_38);
    }
    else {
      cmPropertyMap::SetProperty(&this->Properties,prop,value);
    }
  }
  return;
}

Assistant:

void cmCacheManager::CacheEntry::SetProperty(const std::string& prop,
                                             const char* value)
{
  if (prop == "TYPE") {
    this->Type = cmState::StringToCacheEntryType(value ? value : "STRING");
  } else if (prop == "VALUE") {
    this->Value = value ? value : "";
  } else {
    this->Properties.SetProperty(prop, value);
  }
}